

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

TextureCubeArray * __thiscall
tcu::TextureCubeArray::operator=(TextureCubeArray *this,TextureCubeArray *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  TextureCubeArrayView local_30;
  TextureCubeArray *local_20;
  TextureCubeArray *other_local;
  TextureCubeArray *this_local;
  
  if (this != other) {
    local_20 = other;
    other_local = this;
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    this->m_size = local_20->m_size;
    this->m_depth = local_20->m_depth;
    numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
    levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
              super_ConstPixelBufferAccess;
    TextureCubeArrayView::TextureCubeArrayView(&local_30,numLevels,levels);
    (this->m_view).m_numLevels = local_30.m_numLevels;
    *(undefined4 *)&(this->m_view).field_0x4 = local_30._4_4_;
    (this->m_view).m_levels = local_30.m_levels;
  }
  return this;
}

Assistant:

TextureCubeArray& TextureCubeArray::operator= (const TextureCubeArray& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_size	= other.m_size;
	m_depth	= other.m_depth;
	m_view	= TextureCubeArrayView(getNumLevels(), getLevels());

	DE_ASSERT(m_depth % 6 == 0);

	return *this;
}